

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O2

void __thiscall
CMU462::DynamicScene::Skeleton::newPickElement(Skeleton *this,int *pickID,Joint *joint)

{
  uint uVar1;
  mapped_type *ppJVar2;
  
  uVar1 = *pickID;
  glColor3ub(uVar1 & 0xff,uVar1 >> 8 & 0xff,uVar1 >> 0x10 & 0xff);
  ppJVar2 = std::
            map<int,_CMU462::DynamicScene::Joint_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Joint_*>_>_>
            ::operator[](&this->idToJoint,pickID);
  *ppJVar2 = joint;
  *pickID = *pickID + 1;
  return;
}

Assistant:

void Skeleton::newPickElement(int& pickID, Joint* joint)
  {
    unsigned char R, G, B;
    IndexToRGB(pickID, R, G, B);
    glColor3ub(R, G, B);
    idToJoint[pickID] = joint;
    pickID++;
  }